

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

idx_t duckdb::GetLogicalTypeScore(LogicalType *type)

{
  switch((ulong)type & 0xff) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 0x25:
  case 0x26:
    return 0;
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 0x21:
  case 0x23:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x33:
  case 0x34:
  case 0x35:
    goto switchD_00e713c7_caseD_4;
  case 10:
    return 10;
  case 0xb:
    return 0xc;
  case 0xc:
    return 0xe;
  case 0xd:
    return 0x10;
  case 0xe:
    return 0x12;
  case 0xf:
    return 0x33;
  case 0x10:
  case 0x22:
    return 0x32;
  case 0x11:
    return 0x34;
  case 0x12:
    return 0x35;
  case 0x13:
  case 0x20:
    return 0x36;
  case 0x14:
    return 0x37;
  case 0x15:
    return 0x15;
  case 0x16:
    return 0x16;
  case 0x17:
    return 0x17;
  case 0x18:
    return 0x4b;
  case 0x19:
    return 0x4d;
  case 0x1a:
    return 0x65;
  case 0x1b:
    return 0x38;
  case 0x1c:
    return 0xb;
  case 0x1d:
    return 0xd;
  case 0x1e:
    return 0xf;
  case 0x1f:
    return 0x11;
  case 0x24:
    return 100;
  case 0x27:
    return 0x67;
  case 0x31:
    return 0x13;
  case 0x32:
    return 0x14;
  case 0x36:
    return 0x66;
  default:
    switch((int)((ulong)type & 0xff)) {
    case 100:
      return 0x7d;
    case 0x65:
    case 0x6c:
      return 0x7e;
    case 0x66:
      return 0x7f;
    case 0x67:
    case 0x6b:
      return 0x96;
    case 0x68:
      return 0x4e;
    }
switchD_00e713c7_caseD_4:
    return 1000;
  }
}

Assistant:

static idx_t GetLogicalTypeScore(const LogicalType &type) {
	switch (type.id()) {
	case LogicalTypeId::INVALID:
	case LogicalTypeId::SQLNULL:
	case LogicalTypeId::UNKNOWN:
	case LogicalTypeId::ANY:
	case LogicalTypeId::STRING_LITERAL:
	case LogicalTypeId::INTEGER_LITERAL:
		return 0;
	// numerics
	case LogicalTypeId::BOOLEAN:
		return 10;
	case LogicalTypeId::UTINYINT:
		return 11;
	case LogicalTypeId::TINYINT:
		return 12;
	case LogicalTypeId::USMALLINT:
		return 13;
	case LogicalTypeId::SMALLINT:
		return 14;
	case LogicalTypeId::UINTEGER:
		return 15;
	case LogicalTypeId::INTEGER:
		return 16;
	case LogicalTypeId::UBIGINT:
		return 17;
	case LogicalTypeId::BIGINT:
		return 18;
	case LogicalTypeId::UHUGEINT:
		return 19;
	case LogicalTypeId::HUGEINT:
		return 20;
	case LogicalTypeId::DECIMAL:
		return 21;
	case LogicalTypeId::FLOAT:
		return 22;
	case LogicalTypeId::DOUBLE:
		return 23;
	// date/time/timestamp
	case LogicalTypeId::TIME:
	case LogicalTypeId::TIME_TZ:
		return 50;
	case LogicalTypeId::DATE:
		return 51;
	case LogicalTypeId::TIMESTAMP_SEC:
		return 52;
	case LogicalTypeId::TIMESTAMP_MS:
		return 53;
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ:
		return 54;
	case LogicalTypeId::TIMESTAMP_NS:
		return 55;
	case LogicalTypeId::INTERVAL:
		return 56;
	// text/character strings
	case LogicalTypeId::CHAR:
		return 75;
	case LogicalTypeId::VARCHAR:
		return 77;
	case LogicalTypeId::ENUM:
		return 78;
	// blob/complex types
	case LogicalTypeId::BIT:
		return 100;
	case LogicalTypeId::BLOB:
		return 101;
	case LogicalTypeId::UUID:
		return 102;
	case LogicalTypeId::VARINT:
		return 103;
	// nested types
	case LogicalTypeId::STRUCT:
		return 125;
	case LogicalTypeId::LIST:
	case LogicalTypeId::ARRAY:
		return 126;
	case LogicalTypeId::MAP:
		return 127;
	case LogicalTypeId::UNION:
	case LogicalTypeId::TABLE:
		return 150;
	// weirdo types
	case LogicalTypeId::LAMBDA:
	case LogicalTypeId::AGGREGATE_STATE:
	case LogicalTypeId::POINTER:
	case LogicalTypeId::VALIDITY:
	case LogicalTypeId::USER:
		break;
	}
	return 1000;
}